

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementFormControlTextArea.cpp
# Opt level: O0

bool __thiscall Rml::ElementFormControlTextArea::GetWordWrap(ElementFormControlTextArea *this)

{
  bool bVar1;
  allocator<char> local_89;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  allocator<char> local_51;
  String local_50;
  undefined1 local_30 [8];
  String attribute;
  ElementFormControlTextArea *this_local;
  
  attribute.field_2._8_8_ = this;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"wrap",&local_51);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"",&local_89);
  Element::GetAttribute<std::__cxx11::string>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30,
             (Element *)this,&local_50,&local_88);
  ::std::__cxx11::string::~string((string *)&local_88);
  ::std::allocator<char>::~allocator(&local_89);
  ::std::__cxx11::string::~string((string *)&local_50);
  ::std::allocator<char>::~allocator(&local_51);
  bVar1 = ::std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_30,"nowrap");
  ::std::__cxx11::string::~string((string *)local_30);
  return bVar1;
}

Assistant:

bool ElementFormControlTextArea::GetWordWrap()
{
	String attribute = GetAttribute<String>("wrap", "");
	return attribute != "nowrap";
}